

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkobj.c
# Opt level: O3

monst * get_mtraits(obj *obj,boolean copyof)

{
  byte bVar1;
  short sVar2;
  monst *__dest;
  monst *pmVar3;
  
  if ((obj->oxlth == 0) || ((*(uint *)&obj->field_0x4a & 0x600000) != 0x200000)) {
    pmVar3 = (monst *)0x0;
  }
  else {
    pmVar3 = (monst *)obj->oextra;
    if (copyof != '\0') {
      sVar2 = *(short *)((long)&obj[2].nobj + 2);
      bVar1 = *(byte *)&obj[2].nobj;
      __dest = newmonst((uint)*(byte *)((long)&obj[2].nobj + 1),(uint)bVar1);
      pmVar3 = (monst *)memcpy(__dest,pmVar3,(long)sVar2 + (ulong)bVar1 + 0x78);
      return pmVar3;
    }
  }
  return pmVar3;
}

Assistant:

struct monst *get_mtraits(struct obj *obj, boolean copyof)
{
	struct monst *mtmp = NULL;
	struct monst *mnew = NULL;

	if (obj->oxlth && obj->oattached == OATTACHED_MONST)
		mtmp = (struct monst *)obj->oextra;
	if (mtmp) {
	    if (copyof) {
		int lth = mtmp->mxlth + mtmp->mnamelth + sizeof(struct monst);
		mnew = newmonst(mtmp->mxtyp, mtmp->mnamelth);
		memcpy(mnew, mtmp, lth);
	    } else {
	      /* Never insert this returned pointer into mon chains! */
	    	mnew = mtmp;
	    }
	}
	return mnew;
}